

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O3

void __thiscall Gillespie::DeleteReaction(Gillespie *this,int index)

{
  pointer psVar1;
  pointer pdVar2;
  range_error *this_00;
  pointer pdVar3;
  pointer __src;
  ulong uVar4;
  double dVar5;
  
  if (-1 < index) {
    uVar4 = (ulong)index;
    psVar1 = (this->reactions_).
             super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar4 < (ulong)((long)(this->reactions_).
                              super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4)) {
      dVar5 = (double)(**(psVar1[uVar4].super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->_vptr_Reaction)();
      this->alpha_sum_ = this->alpha_sum_ - dVar5;
      pdVar2 = (this->alpha_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->alpha_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      __src = pdVar2 + uVar4 + 1;
      if (__src != pdVar3) {
        memmove(pdVar2 + uVar4,__src,(long)pdVar3 - (long)__src);
        pdVar3 = (this->alpha_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      (this->alpha_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar3 + -1;
      std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::_M_erase
                (&this->reactions_,
                 (this->reactions_).
                 super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar4);
      return;
    }
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error
            (this_00,"Gillespie: Reaction index out of range for reaction deletion.");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

void Gillespie::DeleteReaction(int index) {
  if (index >= reactions_.size() || index < 0) {
    throw std::range_error(
        "Gillespie: Reaction index out of range for reaction deletion.");
  }
  // Update alpha sum
  alpha_sum_ -= reactions_[index]->CalculatePropensity();
  // Remove from alpha list
  alpha_list_.erase(alpha_list_.begin() + index);
  // Remove from reactions list
  reactions_.erase(reactions_.begin() + index);
}